

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderAPI.cpp
# Opt level: O1

IterateResult __thiscall
glcts::GeometryShaderInsufficientEmittedVerticesTest::iterate
          (GeometryShaderInsufficientEmittedVerticesTest *this)

{
  GLubyte *pGVar1;
  long *plVar2;
  bool bVar3;
  int iVar4;
  GLuint GVar5;
  deUint32 dVar6;
  uint uVar7;
  GLuint *pGVar8;
  undefined4 extraout_var;
  NotSupportedError *this_00;
  char *description;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  char **sh2_body_parts;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  GLubyte local_281;
  long local_280;
  bool has_shader_compilation_failed;
  uint local_274;
  char *vs_code_specialized_raw;
  char *fs_code_specialized_raw;
  char *gs_triangle_strip;
  char *gs_line_strip;
  char *fs_code;
  char *gs_codes_specialized_raw [2];
  string vs_code_specialized;
  string fs_code_specialized;
  string gs_codes_specialized [2];
  undefined1 local_1b0 [8];
  undefined1 local_1a8 [376];
  
  fs_code = 
  "${VERSION}\n\nprecision highp float;\n\nout vec4 result;\n\nvoid main()\n{\n    result = vec4(1.0, 0.0, 0.0, 0.0);\n}\n"
  ;
  gs_line_strip =
       "${VERSION}\n${GEOMETRY_SHADER_REQUIRE}\n\nlayout (points)                       in;\nlayout (line_strip, max_vertices = 2) out;\n\n${IN_PER_VERTEX_DECL}\nvoid main()\n{\n    gl_Position    = gl_in[0].gl_Position;\n    gl_Position.zw = vec2(0.0, 1.0);\n    EmitVertex();\n}\n"
  ;
  gs_triangle_strip =
       "${VERSION}\n${GEOMETRY_SHADER_REQUIRE}\n\nlayout (points)                           in;\nlayout (triangle_strip, max_vertices = 3) out;\n\n${IN_PER_VERTEX_DECL}\nvoid main()\n{\n    gl_Position    = gl_in[0].gl_Position;\n    gl_Position.zw = vec2(0.0, 1.0);\n    EmitVertex();\n    gl_Position    = gl_in[0].gl_Position;\n    gl_Position.zw = vec2(0.0, 1.0);\n    EmitVertex();\n}\n"
  ;
  has_shader_compilation_failed = true;
  uVar12 = (ulong)this->m_number_of_gs << 2;
  pGVar8 = (GLuint *)operator_new__(uVar12);
  this->m_gs_ids = pGVar8;
  pGVar8 = (GLuint *)operator_new__(uVar12);
  this->m_po_ids = pGVar8;
  if ((this->super_TestCaseBase).m_is_geometry_shader_extension_supported == false) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Geometry shader functionality not supported, skipping",
               fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
               ,0xdb2);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  iVar4 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar9 = CONCAT44(extraout_var,iVar4);
  if (this->m_number_of_gs != 0) {
    uVar12 = 0;
    do {
      GVar5 = (**(code **)(lVar9 + 0x3f0))(0x8dd9);
      this->m_gs_ids[uVar12] = GVar5;
      dVar6 = (**(code **)(lVar9 + 0x800))();
      glu::checkError(dVar6,"glCreateProgram() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                      ,0xdbb);
      GVar5 = (**(code **)(lVar9 + 0x3c8))();
      this->m_po_ids[uVar12] = GVar5;
      dVar6 = (**(code **)(lVar9 + 0x800))();
      glu::checkError(dVar6,"glCreateShader() call(s) failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                      ,0xdbe);
      uVar12 = uVar12 + 1;
    } while (uVar12 < this->m_number_of_gs);
  }
  GVar5 = (**(code **)(lVar9 + 0x3f0))(0x8b30);
  this->m_fs_id = GVar5;
  GVar5 = (**(code **)(lVar9 + 0x3f0))(0x8b31);
  this->m_vs_id = GVar5;
  local_280 = lVar9;
  dVar6 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar6,"glCreateShader() call(s) failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                  ,0xdc4);
  TestCaseBase::specializeShader_abi_cxx11_
            (&fs_code_specialized,&this->super_TestCaseBase,1,&fs_code);
  fs_code_specialized_raw = fs_code_specialized._M_dataplus._M_p;
  TestCaseBase::specializeShader_abi_cxx11_
            (gs_codes_specialized,&this->super_TestCaseBase,1,&gs_line_strip);
  TestCaseBase::specializeShader_abi_cxx11_
            (gs_codes_specialized + 1,&this->super_TestCaseBase,1,&gs_triangle_strip);
  gs_codes_specialized_raw[0] = gs_codes_specialized[0]._M_dataplus._M_p;
  gs_codes_specialized_raw[1] = gs_codes_specialized[1]._M_dataplus._M_p;
  TestCaseBase::specializeShader_abi_cxx11_
            (&vs_code_specialized,&this->super_TestCaseBase,1,&dummy_vs_code);
  vs_code_specialized_raw = vs_code_specialized._M_dataplus._M_p;
  local_274 = (uint)CONCAT71((int7)((ulong)vs_code_specialized._M_dataplus._M_p >> 8),1);
  if (this->m_number_of_gs != 0) {
    sh2_body_parts = gs_codes_specialized_raw;
    uVar12 = 0;
    do {
      bVar3 = TestCaseBase::buildProgram
                        (&this->super_TestCaseBase,this->m_po_ids[uVar12],this->m_fs_id,1,
                         &fs_code_specialized_raw,this->m_gs_ids[uVar12],1,sh2_body_parts,
                         this->m_vs_id,1,&vs_code_specialized_raw,&has_shader_compilation_failed);
      if (!bVar3) {
        local_1b0 = (undefined1  [8])
                    ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Program object linking failed for i = ",0x26);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[",1);
        std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"].",2);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
        local_274 = 0;
        break;
      }
      uVar12 = uVar12 + 1;
      sh2_body_parts = sh2_body_parts + 1;
    } while (uVar12 < this->m_number_of_gs);
  }
  if ((char)local_274 != '\0') {
    pGVar8 = &this->m_texture_id;
    (**(code **)(local_280 + 0x6f8))(1,pGVar8);
    dVar6 = (**(code **)(local_280 + 0x800))();
    glu::checkError(dVar6,"glGenTextures() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                    ,0xde5);
    (**(code **)(local_280 + 0xb8))(0xde1,*pGVar8);
    dVar6 = (**(code **)(local_280 + 0x800))();
    glu::checkError(dVar6,"glBindTexture() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                    ,0xde8);
    (**(code **)(local_280 + 0x1380))(0xde1,1,0x8058,0x10,0x10);
    dVar6 = (**(code **)(local_280 + 0x800))();
    glu::checkError(dVar6,"glTexStorage2D() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                    ,0xdec);
    (**(code **)(local_280 + 0x6d0))(1,&this->m_fbo_id);
    dVar6 = (**(code **)(local_280 + 0x800))();
    glu::checkError(dVar6,"glGenFramebuffers() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                    ,0xdf0);
    (**(code **)(local_280 + 0x78))(0x8d40,this->m_fbo_id);
    dVar6 = (**(code **)(local_280 + 0x800))();
    glu::checkError(dVar6,"glBindFramebuffer() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                    ,0xdf3);
    (**(code **)(local_280 + 0x6a0))(0x8d40,0x8ce0,0xde1,*pGVar8,0);
    dVar6 = (**(code **)(local_280 + 0x800))();
    glu::checkError(dVar6,"glFramebufferTexture2D() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                    ,0xdf6);
    (**(code **)(local_280 + 0x708))(1,&this->m_vao_id);
    dVar6 = (**(code **)(local_280 + 0x800))();
    glu::checkError(dVar6,"glGenVertexArrays() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                    ,0xdfa);
    (**(code **)(local_280 + 0xd8))(this->m_vao_id);
    dVar6 = (**(code **)(local_280 + 0x800))();
    glu::checkError(dVar6,"glBindVertexArray() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                    ,0xdfd);
    (**(code **)(local_280 + 0x1c0))(0,0x3f800000,0,0);
    dVar6 = (**(code **)(local_280 + 0x800))();
    glu::checkError(dVar6,"glClearColor() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                    ,0xe00);
    if (this->m_number_of_gs != 0) {
      uVar12 = 0;
      do {
        (**(code **)(local_280 + 0x1680))(this->m_po_ids[uVar12]);
        dVar6 = (**(code **)(local_280 + 0x800))();
        glu::checkError(dVar6,"glUseProgram() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                        ,0xe06);
        (**(code **)(local_280 + 0x188))(0x4000);
        dVar6 = (**(code **)(local_280 + 0x800))();
        glu::checkError(dVar6,"glClear() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                        ,0xe09);
        (**(code **)(local_280 + 0x538))(0,0,1);
        dVar6 = (**(code **)(local_280 + 0x800))();
        glu::checkError(dVar6,"glDrawArrays() call failed for GL_POINTS pname.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                        ,0xe0c);
        (**(code **)(local_280 + 0x1220))
                  (0,0,this->m_texture_width,this->m_texture_height,0x1908,0x1401,this->m_pixels);
        dVar6 = (**(code **)(local_280 + 0x800))();
        glu::checkError(dVar6,"glReadPixels() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                        ,0xe0f);
        uVar7 = (this->m_texture_height * this->m_texture_width + -1) *
                this->m_number_of_color_components;
        if (uVar7 != 0) {
          pGVar1 = this->m_pixels;
          uVar11 = 0;
          do {
            iVar4 = (int)uVar11;
            if ((((pGVar1[uVar11] != '\0') && (pGVar1[iVar4 + 1U] != 0xff)) &&
                (pGVar1[iVar4 + 2U] != '\0')) && (pGVar1[iVar4 + 3U] != '\0')) {
              local_1b0 = (undefined1  [8])
                          ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->
                          m_log;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Pixel [",7);
              std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"] has color = [",0xf);
              local_281 = this->m_pixels[uVar11];
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,(char *)&local_281,1);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
              local_281 = this->m_pixels[iVar4 + 1U];
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,(char *)&local_281,1);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
              local_281 = this->m_pixels[iVar4 + 2U];
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,(char *)&local_281,1);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
              local_281 = this->m_pixels[iVar4 + 3U];
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,(char *)&local_281,1);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"] ",2);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"instead of [0, 255, 0, 0].",0x1a);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
              std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
              local_274 = 0;
              break;
            }
            uVar10 = iVar4 + this->m_number_of_color_components;
            uVar11 = (ulong)uVar10;
          } while (uVar10 < uVar7);
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 < this->m_number_of_gs);
    }
  }
  description = "Fail";
  if ((local_274 & 1) != 0) {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
             (byte)~(byte)local_274 & QP_TEST_RESULT_FAIL,description);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)vs_code_specialized._M_dataplus._M_p != &vs_code_specialized.field_2) {
    operator_delete(vs_code_specialized._M_dataplus._M_p,
                    vs_code_specialized.field_2._M_allocated_capacity + 1);
  }
  lVar9 = -0x40;
  paVar13 = &gs_codes_specialized[1].field_2;
  do {
    plVar2 = (long *)(((string *)(paVar13 + -1))->_M_dataplus)._M_p;
    if (paVar13 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)plVar2) {
      operator_delete(plVar2,paVar13->_M_allocated_capacity + 1);
    }
    paVar13 = paVar13 + -2;
    lVar9 = lVar9 + 0x20;
  } while (lVar9 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)fs_code_specialized._M_dataplus._M_p != &fs_code_specialized.field_2) {
    operator_delete(fs_code_specialized._M_dataplus._M_p,
                    fs_code_specialized.field_2._M_allocated_capacity + 1);
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult GeometryShaderInsufficientEmittedVerticesTest::iterate()
{
	/* Define Fragment Shader for purpose of this test. */
	const char* fs_code = "${VERSION}\n"
						  "\n"
						  "precision highp float;\n"
						  "\n"
						  "out vec4 result;\n"
						  "\n"
						  "void main()\n"
						  "{\n"
						  "    result = vec4(1.0, 0.0, 0.0, 0.0);\n"
						  "}\n";

	/* Define 2 Geometry Shaders for purpose of this test. */
	const char* gs_line_strip = "${VERSION}\n"
								"${GEOMETRY_SHADER_REQUIRE}\n"
								"\n"
								"layout (points)                       in;\n"
								"layout (line_strip, max_vertices = 2) out;\n"
								"\n"
								"${IN_PER_VERTEX_DECL}"
								"\n"
								"void main()\n"
								"{\n"
								"    gl_Position    = gl_in[0].gl_Position;\n"
								"    gl_Position.zw = vec2(0.0, 1.0);\n"
								"    EmitVertex();\n"
								"}\n";

	const char* gs_triangle_strip = "${VERSION}\n"
									"${GEOMETRY_SHADER_REQUIRE}\n"
									"\n"
									"layout (points)                           in;\n"
									"layout (triangle_strip, max_vertices = 3) out;\n"
									"\n"
									"${IN_PER_VERTEX_DECL}"
									"\n"
									"void main()\n"
									"{\n"
									"    gl_Position    = gl_in[0].gl_Position;\n"
									"    gl_Position.zw = vec2(0.0, 1.0);\n"
									"    EmitVertex();\n"

									"    gl_Position    = gl_in[0].gl_Position;\n"
									"    gl_Position.zw = vec2(0.0, 1.0);\n"
									"    EmitVertex();\n"
									"}\n";

	bool has_shader_compilation_failed = true;
	bool result						   = true;

	m_gs_ids = new glw::GLuint[m_number_of_gs];
	m_po_ids = new glw::GLuint[m_number_of_gs];

	/* This test should only run if EXT_geometry_shader is supported. */
	if (!m_is_geometry_shader_extension_supported)
	{
		throw tcu::NotSupportedError(GEOMETRY_SHADER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Create program objects & geometry shader objects. */
	for (glw::GLuint i = 0; i < m_number_of_gs; ++i)
	{
		m_gs_ids[i] = gl.createShader(GL_GEOMETRY_SHADER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram() call failed.");

		m_po_ids[i] = gl.createProgram();
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() call(s) failed.");
	}

	/* Create shader object. */
	m_fs_id = gl.createShader(GL_FRAGMENT_SHADER);
	m_vs_id = gl.createShader(GL_VERTEX_SHADER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() call(s) failed.");

	/* Try to link the test program object */
	std::string fs_code_specialized		= specializeShader(1, &fs_code);
	const char* fs_code_specialized_raw = fs_code_specialized.c_str();

	std::string gs_codes_specialized[] = { specializeShader(1, &gs_line_strip),
										   specializeShader(1, &gs_triangle_strip) };

	const char* gs_codes_specialized_raw[] = { gs_codes_specialized[0].c_str(), gs_codes_specialized[1].c_str() };

	std::string vs_code_specialized		= specializeShader(1, &dummy_vs_code);
	const char* vs_code_specialized_raw = vs_code_specialized.c_str();

	for (glw::GLuint i = 0; i < m_number_of_gs; ++i)
	{
		if (!TestCaseBase::buildProgram(m_po_ids[i], m_fs_id, 1,				  /* n_sh1_body_parts */
										&fs_code_specialized_raw, m_gs_ids[i], 1, /* n_sh2_body_parts */
										&gs_codes_specialized_raw[i], m_vs_id, 1, /* n_sh3_body_parts */
										&vs_code_specialized_raw, &has_shader_compilation_failed))
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Program object linking failed for i = "
							   << "[" << i << "]." << tcu::TestLog::EndMessage;

			result = false;
			break;
		}
	}

	if (result)
	{
		/* Create a 2D texture. */
		gl.genTextures(1, &m_texture_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures() call failed.");

		gl.bindTexture(GL_TEXTURE_2D, m_texture_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture() call failed.");

		gl.texStorage2D(GL_TEXTURE_2D, 1 /*levels*/, GL_RGBA8, 16 /*width taken from spec*/,
						16 /*height taken from spec*/);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glTexStorage2D() call failed.");

		/* Configure FBO. */
		gl.genFramebuffers(1, &m_fbo_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenFramebuffers() call failed.");

		gl.bindFramebuffer(GL_FRAMEBUFFER, m_fbo_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer() call failed.");

		gl.framebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, m_texture_id, 0 /*level*/);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferTexture2D() call failed.");

		/* Configure VAO. */
		gl.genVertexArrays(1, &m_vao_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenVertexArrays() call failed.");

		gl.bindVertexArray(m_vao_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindVertexArray() call failed.");

		gl.clearColor(0.0f, 1.0f, 0.0f, 0.0f);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glClearColor() call failed.");

		for (glw::GLuint po = 0; po < m_number_of_gs; ++po)
		{
			/* Use Program Object. */
			gl.useProgram(m_po_ids[po]);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() call failed.");

			gl.clear(GL_COLOR_BUFFER_BIT);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glClear() call failed.");

			gl.drawArrays(GL_POINTS, 0 /*first*/, 1 /*count*/);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays() call failed for GL_POINTS pname.");

			gl.readPixels(0 /*x*/, 0 /*y*/, m_texture_width, m_texture_height, GL_RGBA, GL_UNSIGNED_BYTE, m_pixels);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels() call failed.");

			for (glw::GLuint pixel = 0; pixel < (m_texture_width * m_texture_height * m_number_of_color_components -
												 m_number_of_color_components);
				 pixel += m_number_of_color_components)
			{
				if (m_pixels[pixel] != 0 && m_pixels[pixel + 1] != 255 && m_pixels[pixel + 2] != 0 &&
					m_pixels[pixel + 3] != 0)
				{
					result = false;

					m_testCtx.getLog() << tcu::TestLog::Message << "Pixel [" << pixel << "] has color = ["
									   << m_pixels[pixel] << ", " << m_pixels[pixel + 1] << ", " << m_pixels[pixel + 2]
									   << ", " << m_pixels[pixel + 3] << "] "
									   << "instead of [0, 255, 0, 0]." << tcu::TestLog::EndMessage;

					break;
				}
			}
		}
	}

	if (result)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}